

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O1

url_mapper * __thiscall
cppcms::url_mapper::get_mapper_for_key
          (url_mapper *this,string_key *key,string_key *real_key,
          vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *keywords)

{
  char cVar1;
  url_mapper *puVar2;
  string_key *psVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  url_mapper *local_90;
  string_key *local_88;
  url_mapper *local_80;
  string_key local_78;
  vector<cppcms::string_key,_std::allocator<cppcms::string_key>_> *local_40;
  string *local_38;
  
  pcVar5 = key->begin_;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (key->key_)._M_dataplus._M_p;
    pcVar6 = pcVar5 + (key->key_)._M_string_length;
  }
  else {
    pcVar6 = key->end_;
  }
  if (pcVar6 == pcVar5) {
    (real_key->key_)._M_string_length = 0;
    real_key->begin_ = (char *)0x0;
    real_key->end_ = (char *)0x0;
    *(real_key->key_)._M_dataplus._M_p = '\0';
    local_80 = this;
  }
  else {
    cVar1 = *pcVar5;
    local_88 = real_key;
    if (cVar1 == '/') {
      this = topmost(this);
    }
    uVar12 = (ulong)(cVar1 == '/');
    local_38 = (string *)&local_88->key_;
    local_90 = this;
    local_40 = keywords;
    do {
      paVar10 = &local_78.key_.field_2;
      pcVar5 = key->begin_;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (key->key_)._M_dataplus._M_p;
        pcVar6 = pcVar5 + (key->key_)._M_string_length;
      }
      else {
        pcVar6 = key->end_;
      }
      uVar7 = (long)pcVar6 - (long)pcVar5;
      uVar8 = 0xffffffffffffffff;
      uVar9 = uVar12;
      if (uVar12 < uVar7) {
        do {
          uVar8 = uVar9;
          if (pcVar5[uVar9] == '/') break;
          uVar8 = uVar9 + 1;
          uVar9 = uVar8;
        } while (uVar8 <= uVar7);
        if (uVar7 <= uVar8) {
          uVar8 = 0xffffffffffffffff;
        }
      }
      if (uVar8 == 0xffffffffffffffff) {
        uVar11 = 0xffffffffffffffff;
        uVar9 = uVar12;
        if (uVar12 < uVar7) {
          do {
            uVar11 = uVar9;
            if (pcVar5[uVar9] == ';') break;
            uVar11 = uVar9 + 1;
            uVar9 = uVar11;
          } while (uVar11 <= uVar7);
          if (uVar7 <= uVar11) {
            uVar11 = 0xffffffffffffffff;
          }
        }
        if (uVar11 == 0xffffffffffffffff) {
          if (uVar12 < uVar7) {
            local_c8._0_8_ = pcVar5 + uVar12;
            local_c8._8_8_ = pcVar6;
            if ((long)pcVar6 - local_c8._0_8_ == -1) {
              local_c8._8_8_ = (char *)(local_c8._0_8_ + -1);
            }
          }
          else {
            local_c8._0_8_ = (char *)0x0;
            local_c8._8_8_ = (char *)0x0;
          }
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_88->begin_ = (char *)local_c8._0_8_;
          local_88->end_ = (char *)local_c8._8_8_;
          local_b8._M_p = (pointer)&local_a8;
          std::__cxx11::string::operator=(local_38,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != &local_a8) {
            operator_delete(local_b8._M_p);
          }
        }
        else {
          std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::reserve(keywords,6);
          pcVar5 = key->begin_;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = (key->key_)._M_dataplus._M_p;
            local_c8._8_8_ = pcVar5 + (key->key_)._M_string_length;
          }
          else {
            local_c8._8_8_ = key->end_;
          }
          if (uVar12 < (ulong)(local_c8._8_8_ - (long)pcVar5)) {
            local_c8._0_8_ = pcVar5 + uVar12;
            if (uVar11 - uVar12 <= (ulong)(local_c8._8_8_ - local_c8._0_8_)) {
              local_c8._8_8_ = pcVar5 + uVar11;
            }
          }
          else {
            local_c8._0_8_ = (char *)0x0;
            local_c8._8_8_ = (char *)0x0;
          }
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_88->begin_ = (char *)local_c8._0_8_;
          local_88->end_ = (char *)local_c8._8_8_;
          local_b8._M_p = (pointer)&local_a8;
          std::__cxx11::string::operator=(local_38,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != &local_a8) {
            operator_delete(local_b8._M_p);
          }
          uVar9 = uVar11 + 1;
          do {
            uVar12 = uVar9;
            pcVar5 = key->begin_;
            if (pcVar5 == (char *)0x0) {
              pcVar5 = (key->key_)._M_dataplus._M_p;
              local_c8._8_8_ = pcVar5 + (key->key_)._M_string_length;
            }
            else {
              local_c8._8_8_ = key->end_;
            }
            uVar11 = local_c8._8_8_ - (long)pcVar5;
            uVar7 = 0xffffffffffffffff;
            uVar9 = uVar12;
            if (uVar12 < uVar11) {
              do {
                uVar7 = uVar9;
                if (pcVar5[uVar9] == ',') break;
                uVar7 = uVar9 + 1;
                uVar9 = uVar7;
              } while (uVar7 <= uVar11);
              if (uVar11 <= uVar7) {
                uVar7 = 0xffffffffffffffff;
              }
            }
            if (uVar12 < uVar11) {
              local_c8._0_8_ = pcVar5 + uVar12;
              if (uVar7 - uVar12 <= (ulong)(local_c8._8_8_ - local_c8._0_8_)) {
                local_c8._8_8_ = pcVar5 + uVar7;
              }
            }
            else {
              local_c8._0_8_ = (char *)0x0;
              local_c8._8_8_ = (char *)0x0;
            }
            local_b0 = 0;
            local_a8._M_local_buf[0] = '\0';
            local_b8._M_p = (pointer)&local_a8;
            std::vector<cppcms::string_key,_std::allocator<cppcms::string_key>_>::
            emplace_back<cppcms::string_key>(keywords,(string_key *)local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_p != &local_a8) {
              operator_delete(local_b8._M_p);
            }
            uVar9 = uVar7 + 1;
          } while (uVar7 + 1 != 0);
        }
        local_c8._0_8_ = ".";
        local_c8._8_8_ = "";
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        bVar4 = string_key::operator==(local_88,(string_key *)local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (bVar4) {
LAB_001dea1c:
          (local_88->key_)._M_string_length = 0;
          local_88->begin_ = (char *)0x0;
          local_88->end_ = (char *)0x0;
          *(local_88->key_)._M_dataplus._M_p = '\0';
        }
        else {
          local_c8._0_8_ = "..";
          local_c8._8_8_ = "";
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_b8._M_p = (pointer)&local_a8;
          bVar4 = string_key::operator==(local_88,(string_key *)local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != &local_a8) {
            operator_delete(local_b8._M_p);
          }
          if (bVar4) {
            local_90 = parent(local_90);
            goto LAB_001dea1c;
          }
        }
        psVar3 = local_88;
        puVar2 = local_90;
        local_80 = data::is_app((local_90->d).ptr_,local_88);
        keywords = local_40;
        if (local_80 == (url_mapper *)0x0) {
          local_80 = puVar2;
        }
        else {
          (psVar3->key_)._M_string_length = 0;
          psVar3->begin_ = (char *)0x0;
          psVar3->end_ = (char *)0x0;
          *(psVar3->key_)._M_dataplus._M_p = '\0';
        }
      }
      else {
        if (uVar12 < uVar7) {
          local_78.begin_ = pcVar5 + uVar12;
          local_78.end_ = pcVar6;
          if (uVar8 - uVar12 <= (ulong)((long)pcVar6 - (long)local_78.begin_)) {
            local_78.end_ = pcVar5 + uVar8;
          }
        }
        else {
          local_78.begin_ = (char *)0x0;
          local_78.end_ = (char *)0x0;
        }
        local_78.key_._M_string_length = 0;
        local_78.key_.field_2._M_local_buf[0] = '\0';
        local_c8._0_8_ = ".";
        local_c8._8_8_ = "";
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_78.key_._M_dataplus._M_p = (pointer)paVar10;
        bVar4 = string_key::operator==(&local_78,(string_key *)local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (!bVar4) {
          local_c8._0_8_ = "..";
          local_c8._8_8_ = "";
          local_b0 = 0;
          local_a8._M_local_buf[0] = '\0';
          local_b8._M_p = (pointer)&local_a8;
          bVar4 = string_key::operator==(&local_78,(string_key *)local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_p != &local_a8) {
            operator_delete(local_b8._M_p);
          }
          if (bVar4) {
            local_90 = parent(local_90);
          }
          else {
            local_90 = data::child((local_90->d).ptr_,&local_78,key);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.key_._M_dataplus._M_p != paVar10) {
          operator_delete(local_78.key_._M_dataplus._M_p);
        }
        uVar12 = uVar8 + 1;
      }
    } while (uVar8 != 0xffffffffffffffff);
  }
  return local_80;
}

Assistant:

url_mapper &url_mapper::get_mapper_for_key(string_key const &key,string_key &real_key,std::vector<string_key> &keywords)
	{
		url_mapper *mapper = this;
		size_t pos = 0;
		if(key.empty()) {
			real_key.clear();
			return *mapper;
		}
		if(key[0]=='/') {
			mapper = &mapper->topmost();
			pos = 1;
		}
		for(;;) {
			size_t end = key.find('/',pos);
			if(end == std::string::npos) {
				size_t separator = key.find(';',pos);
				if(separator == std::string::npos) {
					real_key = key.unowned_substr(pos);
				}
				else {
					keywords.reserve(6);
					real_key = key.unowned_substr(pos,separator - pos);
					pos = separator + 1;
					for(;;){
						end = key.find(',',pos);
						size_t size = end - pos;
						keywords.push_back(key.unowned_substr(pos,size));
						if(end == std::string::npos)
							break;
						pos = end + 1;
					}
					
				}
				if(real_key == ".")
					real_key.clear();
				else if(real_key == "..") {
					mapper = &mapper->parent();
					real_key.clear();
				}
					
				url_mapper *tmp = mapper->d->is_app(real_key);
				if(tmp) { 
					// empty special key
					real_key.clear();
					return *tmp;
				}
				return *mapper;
			}
			size_t chunk_size = end - pos;
			string_key subapp = key.unowned_substr(pos,chunk_size);
			if(subapp == ".")
				; // Just continue where we are
			else if(subapp == "..") {
				mapper = &mapper->parent();
			}
			else {
				mapper = &mapper->d->child(subapp,key);
			}
			pos = end + 1;
		}
	}